

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall Lexer::Lexify(Lexer *this,char *code)

{
  ulong uVar1;
  int iVar2;
  LexemeType LVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  byte *__s1;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  Lexeme lex;
  
  SmallArray<Lexeme,_32U>::reserve(&this->lexems,0x800);
  this->line = 0;
  uVar8 = 0;
  __s1 = (byte *)code;
LAB_001b6f1e:
  bVar6 = *__s1;
LAB_001b6f21:
  uVar9 = (uint)__s1;
  switch(bVar6) {
  case 9:
  case 0x20:
    goto switchD_001b6f37_caseD_9;
  case 10:
    code = (char *)(__s1 + 1);
    uVar8 = uVar8 + 1;
    this->line = uVar8;
    __s1 = (byte *)code;
    goto LAB_001b6f1e;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x23:
  case 0x24:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
switchD_001b6f37_caseD_b:
    if ((byte)(bVar6 - 0x30) < 10) {
      if ((bVar6 == 0x30) && (__s1[1] == 0x78)) {
        for (pbVar7 = __s1 + 2;
            (bVar6 = *pbVar7, (byte)(bVar6 - 0x30) < 10 || ((byte)((bVar6 & 0xdf) + 0xbf) < 6));
            pbVar7 = pbVar7 + 1) {
        }
      }
      else {
        pbVar7 = __s1 + -1;
        do {
          bVar6 = pbVar7[1];
          pbVar7 = pbVar7 + 1;
        } while ((byte)(bVar6 - 0x30) < 10);
      }
      pbVar7 = pbVar7 + (bVar6 == 0x2e);
      do {
        pbVar4 = pbVar7;
        pbVar7 = pbVar4 + 1;
      } while ((byte)(*pbVar4 - 0x30) < 10);
      pbVar5 = pbVar4;
      if ((*pbVar4 == 0x65) && (pbVar5 = pbVar7, *pbVar7 == 0x2d)) {
        pbVar5 = pbVar4 + 2;
      }
      uVar11 = (ulong)(~uVar9 + (int)pbVar5);
      do {
        bVar6 = *pbVar5;
        pbVar5 = pbVar5 + 1;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while ((byte)(bVar6 - 0x30) < 10);
      lex.type = lex_number;
      goto LAB_001b7498;
    }
    LVar3 = lex_none;
    if (-1 < (char)""[bVar6]) break;
    uVar1 = 0;
    do {
      uVar11 = uVar1;
      uVar1 = uVar11 + 1;
    } while ((""[__s1[uVar11]] & 0x40) != 0);
    switch((int)uVar11) {
    case 2:
      if (*(short *)__s1 == 0x6669) {
        lex.type = lex_if;
      }
      else {
        if (*(short *)__s1 != 0x6e69) {
          uVar10 = 2;
          lex.type = lex_string;
          if (*(short *)__s1 == 0x6f64) {
            lex.type = lex_do;
          }
          break;
        }
        lex.type = lex_in;
      }
LAB_001b74d1:
      uVar10 = 2;
      break;
    case 3:
      iVar2 = bcmp(__s1,"for",3);
      if (iVar2 == 0) {
        lex.type = lex_for;
      }
      else {
        iVar2 = bcmp(__s1,"ref",3);
        if (iVar2 == 0) {
          lex.type = lex_ref;
        }
        else {
          iVar2 = bcmp(__s1,"new",3);
          lex.type = lex_string;
          if (iVar2 == 0) {
            lex.type = lex_new;
          }
        }
      }
      uVar10 = 3;
      break;
    case 4:
      if (*(int *)__s1 == 0x65736163) {
        lex.type = lex_case;
      }
      else if (*(int *)__s1 == 0x65736c65) {
        lex.type = lex_else;
      }
      else if (*(int *)__s1 == 0x6f747561) {
        lex.type = lex_auto;
      }
      else if (*(int *)__s1 == 0x65757274) {
        lex.type = lex_true;
      }
      else if (*(int *)__s1 == 0x6d756e65) {
        lex.type = lex_enum;
      }
      else {
        lex.type = lex_string;
        if (*(int *)__s1 == 0x68746977) {
          lex.type = lex_with;
        }
      }
      uVar10 = 4;
      break;
    case 5:
      iVar2 = bcmp(__s1,"while",5);
      if (iVar2 == 0) {
        lex.type = lex_while;
      }
      else {
        iVar2 = bcmp(__s1,"break",5);
        if (iVar2 == 0) {
          lex.type = lex_break;
        }
        else {
          iVar2 = bcmp(__s1,"class",5);
          if (iVar2 == 0) {
            lex.type = lex_class;
          }
          else {
            iVar2 = bcmp(__s1,"align",5);
            if (iVar2 == 0) {
              lex.type = lex_align;
            }
            else {
              iVar2 = bcmp(__s1,"yield",5);
              if (iVar2 == 0) {
                lex.type = lex_yield;
              }
              else {
                iVar2 = bcmp(__s1,"const",5);
                if (iVar2 == 0) {
                  lex.type = lex_const;
                }
                else {
                  iVar2 = bcmp(__s1,"false",5);
                  lex.type = lex_string;
                  if (iVar2 == 0) {
                    lex.type = lex_false;
                  }
                }
              }
            }
          }
        }
      }
      uVar10 = 5;
      break;
    case 6:
      iVar2 = bcmp(__s1,"switch",6);
      if (iVar2 == 0) {
        lex.type = lex_switch;
      }
      else {
        iVar2 = bcmp(__s1,"return",6);
        if (iVar2 == 0) {
          lex.type = lex_return;
        }
        else {
          iVar2 = bcmp(__s1,"typeof",6);
          if (iVar2 == 0) {
            lex.type = lex_typeof;
          }
          else {
            iVar2 = bcmp(__s1,"sizeof",6);
            if (iVar2 == 0) {
              lex.type = lex_sizeof;
            }
            else {
              iVar2 = bcmp(__s1,"import",6);
              lex.type = lex_string;
              if (iVar2 == 0) {
                lex.type = lex_import;
              }
            }
          }
        }
      }
      uVar10 = 6;
      break;
    case 7:
      iVar2 = bcmp(__s1,"noalign",7);
      if (iVar2 == 0) {
        lex.type = lex_noalign;
      }
      else {
        iVar2 = bcmp(__s1,"default",7);
        if (iVar2 == 0) {
          lex.type = lex_default;
        }
        else {
          iVar2 = bcmp(__s1,"typedef",7);
          if (iVar2 == 0) {
            lex.type = lex_typedef;
          }
          else {
            iVar2 = bcmp(__s1,"nullptr",7);
            if (iVar2 == 0) {
              lex.type = lex_nullptr;
            }
            else {
              iVar2 = bcmp(__s1,"generic",7);
              lex.type = lex_string;
              if (iVar2 == 0) {
                lex.type = lex_generic;
              }
            }
          }
        }
      }
      uVar10 = 7;
      break;
    case 8:
      if (*(long *)__s1 == 0x65756e69746e6f63) {
        lex.type = lex_continue;
      }
      else {
        lex.type = lex_string;
        if (*(long *)__s1 == 0x726f74617265706f) {
          lex.type = lex_operator;
        }
      }
      uVar10 = 8;
      break;
    case 9:
      iVar2 = bcmp(__s1,"coroutine",9);
      if (iVar2 == 0) {
        lex.type = lex_coroutine;
      }
      else {
        iVar2 = bcmp(__s1,"namespace",9);
        lex.type = lex_string;
        if (iVar2 == 0) {
          lex.type = lex_namespace;
        }
      }
      uVar10 = 9;
      break;
    case 10:
      iVar2 = bcmp(__s1,"extendable",10);
      lex.type = lex_string;
      if (iVar2 == 0) {
        lex.type = lex_extendable;
      }
      uVar10 = 10;
      break;
    default:
      lex.type = lex_string;
      goto LAB_001b7498;
    }
    goto LAB_001b74e3;
  case 0xd:
    code = (char *)(__s1 + 1);
    if (__s1[1] == 10) {
      code = (char *)(__s1 + 2);
    }
    uVar8 = uVar8 + 1;
    this->line = uVar8;
    __s1 = (byte *)code;
    goto LAB_001b6f1e;
  case 0x21:
    bVar6 = __s1[1];
    lex.type = lex_lognot;
    LVar3 = lex_nequal;
    goto LAB_001b71e8;
  case 0x22:
    pbVar7 = __s1 + 1;
    goto LAB_001b72fc;
  case 0x25:
    bVar6 = __s1[1];
    lex.type = lex_mod;
    LVar3 = lex_modset;
LAB_001b71e8:
    bVar12 = bVar6 == 0x3d;
    if (bVar12) {
      lex.type = LVar3;
    }
LAB_001b7283:
    uVar10 = bVar12 + 1;
    goto LAB_001b74e3;
  case 0x26:
    if (__s1[1] == 0x26) {
      lex.type = lex_logand;
    }
    else {
      if (__s1[1] != 0x3d) {
        LVar3 = lex_bitand;
        break;
      }
      lex.type = lex_andset;
    }
    goto LAB_001b74d1;
  case 0x27:
    pbVar7 = __s1 + 1;
    goto LAB_001b7128;
  case 0x28:
    LVar3 = lex_oparen;
    break;
  case 0x29:
    LVar3 = lex_cparen;
    break;
  case 0x2a:
    if (__s1[1] == 0x3d) {
      lex.type = lex_mulset;
      goto LAB_001b74d1;
    }
    if (__s1[1] == 0x2a) {
      bVar12 = __s1[2] == 0x3d;
      uVar10 = (uint)bVar12;
      lex.type = lex_pow;
      LVar3 = lex_powset;
LAB_001b72eb:
      if (bVar12) {
        lex.type = LVar3;
      }
      uVar10 = uVar10 | 2;
      goto LAB_001b74e3;
    }
    LVar3 = lex_mul;
    break;
  case 0x2b:
    if (__s1[1] == 0x3d) {
      lex.type = lex_addset;
      goto LAB_001b74d1;
    }
    if (__s1[1] == 0x2b) {
      lex.type = lex_inc;
      goto LAB_001b74d1;
    }
    LVar3 = lex_add;
    break;
  case 0x2c:
    LVar3 = lex_comma;
    break;
  case 0x2d:
    if (__s1[1] == 0x3d) {
      lex.type = lex_subset;
      goto LAB_001b74d1;
    }
    if (__s1[1] == 0x2d) {
      lex.type = lex_dec;
      goto LAB_001b74d1;
    }
    LVar3 = lex_sub;
    break;
  case 0x2e:
    LVar3 = lex_point;
    break;
  case 0x2f:
    goto switchD_001b6f37_caseD_2f;
  case 0x3a:
    LVar3 = lex_colon;
    break;
  case 0x3b:
    LVar3 = lex_semicolon;
    break;
  case 0x3c:
    if (__s1[1] == 0x3d) {
      lex.type = lex_lequal;
      goto LAB_001b74d1;
    }
    if (__s1[1] == 0x3c) {
      bVar12 = __s1[2] == 0x3d;
      uVar10 = (uint)bVar12;
      lex.type = lex_shl;
      LVar3 = lex_shlset;
      goto LAB_001b72eb;
    }
    LVar3 = lex_less;
    break;
  case 0x3d:
    bVar12 = __s1[1] == 0x3d;
    lex.type = (uint)!bVar12 * 9 + lex_equal;
    goto LAB_001b7283;
  case 0x3e:
    if (__s1[1] == 0x3d) {
      lex.type = lex_gequal;
      goto LAB_001b74d1;
    }
    if (__s1[1] == 0x3e) {
      bVar12 = __s1[2] == 0x3d;
      uVar10 = (uint)bVar12;
      lex.type = lex_shr;
      LVar3 = lex_shrset;
      goto LAB_001b72eb;
    }
    LVar3 = lex_greater;
    break;
  case 0x3f:
    LVar3 = lex_questionmark;
    break;
  case 0x40:
    LVar3 = lex_at;
    break;
  default:
    switch(bVar6) {
    case 0x7b:
      LVar3 = lex_ofigure;
      break;
    case 0x7c:
      if (__s1[1] == 0x7c) {
        lex.type = lex_logor;
        goto LAB_001b74d1;
      }
      if (__s1[1] == 0x3d) {
        lex.type = lex_orset;
        goto LAB_001b74d1;
      }
      LVar3 = lex_bitor;
      break;
    case 0x7d:
      LVar3 = lex_cfigure;
      break;
    case 0x7e:
      LVar3 = lex_bitnot;
      break;
    default:
      if (bVar6 == 0) {
        lex.type = lex_none;
        lex.length = 1;
        lex.column = uVar9 - (int)code;
        lex.pos = (char *)__s1;
        lex.line = uVar8;
        SmallArray<Lexeme,_32U>::push_back(&this->lexems,&lex);
        return;
      }
      if (bVar6 == 0x5b) {
        LVar3 = lex_obracket;
      }
      else if (bVar6 == 0x5d) {
        LVar3 = lex_cbracket;
      }
      else {
        if (bVar6 != 0x5e) goto switchD_001b6f37_caseD_b;
        if (__s1[1] == 0x5e) {
          lex.type = lex_logxor;
          goto LAB_001b74d1;
        }
        if (__s1[1] == 0x3d) {
          lex.type = lex_xorset;
          goto LAB_001b74d1;
        }
        LVar3 = lex_bitxor;
      }
    }
  }
  goto LAB_001b74dd;
switchD_001b6f37_caseD_2f:
  bVar6 = __s1[1];
  if (bVar6 == 0x2a) {
    iVar2 = 1;
    pbVar7 = __s1 + 2;
LAB_001b6f4e:
    while( true ) {
      __s1 = pbVar7;
      pbVar7 = __s1 + 1;
      bVar6 = *__s1;
      if ((bVar6 == 0) || (iVar2 == 0)) goto LAB_001b6f21;
      if (bVar6 == 0x2a) goto LAB_001b6f85;
      if (bVar6 != 0x2f) break;
      if (*pbVar7 == 0x2a) {
        iVar2 = iVar2 + 1;
        goto LAB_001b6f97;
      }
    }
    if (bVar6 != 10) {
      if (bVar6 != 0xd) {
        if (bVar6 == 0x22) {
          do {
            while (bVar6 = *pbVar7, bVar6 == 0x5c) {
              if (pbVar7[1] == 0) {
LAB_001b6fa9:
                pbVar7 = pbVar7 + 1;
              }
              else {
                pbVar7 = pbVar7 + 2;
              }
            }
            if (bVar6 == 0) goto LAB_001b6fed;
            if (bVar6 == 10) {
              code = (char *)(pbVar7 + 1);
            }
            else {
              if (bVar6 != 0xd) {
                if (bVar6 != 0x22) goto LAB_001b6fa9;
                goto LAB_001b6fed;
              }
              code = (char *)(pbVar7 + 1);
              if (pbVar7[1] == 10) {
                code = (char *)(pbVar7 + 2);
              }
            }
            uVar8 = uVar8 + 1;
            this->line = uVar8;
            pbVar7 = (byte *)code;
          } while( true );
        }
        goto LAB_001b6f4e;
      }
      if (*pbVar7 == 10) {
        pbVar7 = __s1 + 2;
      }
    }
    code = (char *)pbVar7;
    uVar8 = uVar8 + 1;
    this->line = uVar8;
    pbVar7 = (byte *)code;
    goto LAB_001b6f4e;
  }
  if (bVar6 == 0x3d) {
    lex.type = lex_divset;
    goto LAB_001b74d1;
  }
  LVar3 = lex_div;
  if (bVar6 == 0x2f) goto LAB_001b7098;
LAB_001b74dd:
  uVar10 = 1;
  lex.type = LVar3;
  goto LAB_001b74e3;
LAB_001b6f85:
  if (*pbVar7 == 0x2f) {
    iVar2 = iVar2 + -1;
LAB_001b6f97:
    pbVar7 = __s1 + 2;
  }
  goto LAB_001b6f4e;
LAB_001b6fed:
  pbVar7 = pbVar7 + (bVar6 == 0x22);
  goto LAB_001b6f4e;
LAB_001b7098:
  while ((bVar6 != 0 && (bVar6 != 10))) {
    pbVar7 = __s1 + 1;
    __s1 = __s1 + 1;
    bVar6 = *pbVar7;
  }
  goto LAB_001b6f1e;
LAB_001b7128:
  bVar6 = *pbVar7;
  if (bVar6 == 0x5c) {
    if (pbVar7[1] == 0) {
LAB_001b7153:
      pbVar7 = pbVar7 + 1;
    }
    else {
      pbVar7 = pbVar7 + 2;
    }
    goto LAB_001b7128;
  }
  if (bVar6 != 0) {
    if (bVar6 == 10) {
      code = (char *)(pbVar7 + 1);
    }
    else {
      if (bVar6 != 0xd) {
        if (bVar6 != 0x27) goto LAB_001b7153;
        goto LAB_001b7180;
      }
      code = (char *)(pbVar7 + 1);
      if (pbVar7[1] == 10) {
        code = (char *)(pbVar7 + 2);
      }
    }
    uVar8 = uVar8 + 1;
    this->line = uVar8;
    pbVar7 = (byte *)code;
    goto LAB_001b7128;
  }
LAB_001b7180:
  uVar11 = (ulong)((((int)pbVar7 + 1) - (uint)(bVar6 == 0)) - uVar9);
  lex.type = lex_semiquotedchar;
  goto LAB_001b7498;
LAB_001b72fc:
  bVar6 = *pbVar7;
  if (bVar6 == 0x5c) {
    if (pbVar7[1] == 0) {
LAB_001b7327:
      pbVar7 = pbVar7 + 1;
    }
    else {
      pbVar7 = pbVar7 + 2;
    }
    goto LAB_001b72fc;
  }
  if (bVar6 != 0) {
    if (bVar6 == 10) {
      code = (char *)(pbVar7 + 1);
    }
    else {
      if (bVar6 != 0xd) {
        if (bVar6 != 0x22) goto LAB_001b7327;
        goto LAB_001b7354;
      }
      code = (char *)(pbVar7 + 1);
      if (pbVar7[1] == 10) {
        code = (char *)(pbVar7 + 2);
      }
    }
    uVar8 = uVar8 + 1;
    this->line = uVar8;
    pbVar7 = (byte *)code;
    goto LAB_001b72fc;
  }
LAB_001b7354:
  uVar11 = (ulong)((((int)pbVar7 + 1) - (uint)(bVar6 == 0)) - uVar9);
  lex.type = lex_quotedstring;
LAB_001b7498:
  uVar10 = (uint)uVar11;
LAB_001b74e3:
  lex.column = uVar9 - (int)code;
  lex.pos = (char *)__s1;
  lex.length = uVar10;
  lex.line = uVar8;
  SmallArray<Lexeme,_32U>::push_back(&this->lexems,&lex);
  uVar8 = this->line;
  __s1 = __s1 + (int)uVar10;
  goto LAB_001b6f1e;
switchD_001b6f37_caseD_9:
  do {
    __s1 = __s1 + 1;
    bVar6 = *__s1;
    if (((byte)(bVar6 - 0x21) < 0xe0) || (bVar6 == 10)) break;
  } while (bVar6 != 0xd);
  goto LAB_001b6f1e;
}

Assistant:

void Lexer::Lexify(const char* code)
{
	lexems.reserve(2048);

	const char *lineStart = code;
	line = 0;

	LexemeType lType = lex_none;
	int lLength = 1;

	while(*code)
	{
		switch(*code)
		{
		case '\r':
			code++;

			if(*code == '\n')
				code++;

			lineStart = code;
			line++;

			continue;
		case '\n':
			code++;

			lineStart = code;
			line++;

			continue;
		case ' ':
		case '\t':
			code++;
			while((unsigned char)(code[0] - 1) < ' ' && *code != '\r' && *code != '\n')
				code++;
			continue;
		case '\"':
			lType = lex_quotedstring;
			{
				const char *pos = code;
				pos++;

				while(*pos && *pos != '\"')
				{
					if(pos[0] == '\\' && pos[1])
					{
						pos += 2;
					}
					else if(pos[0] == '\r')
					{
						pos++;

						if(*pos == '\n')
							pos++;

						lineStart = pos;
						line++;
					}
					else if(pos[0] == '\n')
					{
						pos++;

						lineStart = pos;
						line++;
					}
					else
					{
						pos += 1;
					}
				}

				if(*pos)
					pos++;

				lLength = (int)(pos - code);
			}
			break;
		case '\'':
			lType = lex_semiquotedchar;
			{
				const char *pos = code;
				pos++;

				while(*pos && *pos != '\'')
				{
					if(pos[0] == '\\' && pos[1])
					{
						pos += 2;
					}
					else if(pos[0] == '\r')
					{
						pos++;

						if(*pos == '\n')
							pos++;

						lineStart = pos;
						line++;
					}
					else if(pos[0] == '\n')
					{
						pos++;

						lineStart = pos;
						line++;
					}
					else
					{
						pos += 1;
					}
				}

				if(*pos)
					pos++;

				lLength = (int)(pos - code);
			}
			break;
		case '.':
			lType = lex_point;
			break;
		case ',':
			lType = lex_comma;
			break;
		case '+':
			lType = lex_add;
			if(code[1] == '=')
			{
				lType = lex_addset;
				lLength = 2;
			}else if(code[1] == '+'){
				lType = lex_inc;
				lLength = 2;
			}
			break;
		case '-':
			lType = lex_sub;
			if(code[1] == '=')
			{
				lType = lex_subset;
				lLength = 2;
			}else if(code[1] == '-'){
				lType = lex_dec;
				lLength = 2;
			}
			break;
		case '*':
			lType = lex_mul;
			if(code[1] == '=')
			{
				lType = lex_mulset;
				lLength = 2;
			}else if(code[1] == '*'){
				lType = lex_pow;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_powset;
					lLength = 3;
				}
			}
			break;
		case '/':
			if(code[1] == '=')
			{
				lType = lex_divset;
				lLength = 2;
			}else if(code[1] == '/'){
				while(code[0] != '\n' && code[0] != '\0')
					code++;
				continue;
			}else if(code[1] == '*'){
				code += 2;
				unsigned depth = 1;
				while(*code && depth)
				{
					if(code[0] == '*' && code[1] == '/')
					{
						code += 2;
						depth--;
					}
					else if(code[0] == '/' && code[1] == '*')
					{
						code += 2;
						depth++;
					}
					else if(code[0] == '\"')
					{
						code++;

						while(code[0] && code[0] != '\"')
						{
							if(code[0] == '\\' && code[1])
							{
								code += 2;
							}
							else if(code[0] == '\r')
							{
								code++;

								if(*code == '\n')
									code++;

								lineStart = code;
								line++;
							}
							else if(code[0] == '\n')
							{
								code++;

								lineStart = code;
								line++;
							}
							else
							{
								code += 1;
							}
						}

						if(code[0] == '\"')
							code++;
					}
					else if(code[0] == '\r')
					{
						code++;

						if(*code == '\n')
							code++;

						lineStart = code;
						line++;
					}
					else if(code[0] == '\n')
					{
						code++;

						lineStart = code;
						line++;
					}
					else
					{
						code++;
					}
				}
				continue;
			}else{
				lType = lex_div;
			}
			break;
		case '%':
			lType = lex_mod;
			if(code[1] == '=')
			{
				lType = lex_modset;
				lLength = 2;
			}
			break;
		case '<':
			lType = lex_less;
			if(code[1] == '=')
			{
				lType = lex_lequal;
				lLength = 2;
			}else if(code[1] == '<'){
				lType = lex_shl;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_shlset;
					lLength = 3;
				}
			}
			break;
		case '>':
			lType = lex_greater;
			if(code[1] == '=')
			{
				lType = lex_gequal;
				lLength = 2;
			}else if(code[1] == '>'){
				lType = lex_shr;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_shrset;
					lLength = 3;
				}
			}
			break;
		case '=':
			lType = lex_set;
			if(code[1] == '=')
			{
				lType = lex_equal;
				lLength = 2;
			}
			break;
		case '!':
			lType = lex_lognot;
			if(code[1] == '=')
			{
				lType = lex_nequal;
				lLength = 2;
			}
			break;
		case '@':
			lType = lex_at;
			break;
		case '~':
			lType = lex_bitnot;
			break;
		case '&':
			lType = lex_bitand;
			if(code[1] == '&')
			{
				lType = lex_logand;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_andset;
				lLength = 2;
			}
			break;
		case '|':
			lType = lex_bitor;
			if(code[1] == '|')
			{
				lType = lex_logor;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_orset;
				lLength = 2;
			}
			break;
		case '^':
			lType = lex_bitxor;
			if(code[1] == '^')
			{
				lType = lex_logxor;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_xorset;
				lLength = 2;
			}
			break;
		case '(':
			lType = lex_oparen;
			break;
		case ')':
			lType = lex_cparen;
			break;
		case '[':
			lType = lex_obracket;
			break;
		case ']':
			lType = lex_cbracket;
			break;
		case '{':
			lType = lex_ofigure;
			break;
		case '}':
			lType = lex_cfigure;
			break;
		case '?':
			lType = lex_questionmark;
			break;
		case ':':
			lType = lex_colon;
			break;
		case ';':
			lType = lex_semicolon;
			break;
		default:
			if(isDigit(*code))
			{
				lType = lex_number;

				const char *pos = code;
				if(pos[0] == '0' && pos[1] == 'x')
				{
					pos += 2;
					while(isDigit(*pos) || ((*pos & ~0x20) >= 'A' && (*pos & ~0x20) <= 'F'))
						pos++;
				}else{
					while(isDigit(*pos))
						pos++;
				}
				if(*pos == '.')
					pos++;
				while(isDigit(*pos))
					pos++;
				if(*pos == 'e')
				{
					pos++;
					if(*pos == '-')
						pos++;
				}
				while(isDigit(*pos))
					pos++;
				lLength = (int)(pos - code);
			}else if(chartype_table[(unsigned char)*code] & ct_start_symbol){
				const char *pos = code;
				while(chartype_table[(unsigned char)*pos] & ct_symbol)
					pos++;
				lLength = (int)(pos - code);

				if(!(chartype_table[(unsigned char)*pos] & ct_symbol))
				{
					switch(lLength)
					{
					case 2:
						if(memcmp(code, "if", 2) == 0)
							lType = lex_if;
						else if(memcmp(code, "in", 2) == 0)
							lType = lex_in;
						else if(memcmp(code, "do", 2) == 0)
							lType = lex_do;
						break;
					case 3:
						if(memcmp(code, "for", 3) == 0)
							lType = lex_for;
						else if(memcmp(code, "ref", 3) == 0)
							lType = lex_ref;
						else if(memcmp(code, "new", 3) == 0)
							lType = lex_new;
						break;
					case 4:
						if(memcmp(code, "case", 4) == 0)
							lType = lex_case;
						else if(memcmp(code, "else", 4) == 0)
							lType = lex_else;
						else if(memcmp(code, "auto", 4) == 0)
							lType = lex_auto;
						else if(memcmp(code, "true", 4) == 0)
							lType = lex_true;
						else if(memcmp(code, "enum", 4) == 0)
							lType = lex_enum;
						else if(memcmp(code, "with", 4) == 0)
							lType = lex_with;
						break;
					case 5:
						if(memcmp(code, "while", 5) == 0)
							lType = lex_while;
						else if(memcmp(code, "break", 5) == 0)
							lType = lex_break;
						else if(memcmp(code, "class", 5) == 0)
							lType = lex_class;
						else if(memcmp(code, "align", 5) == 0)
							lType = lex_align;
						else if(memcmp(code, "yield", 5) == 0)
							lType = lex_yield;
						else if(memcmp(code, "const", 5) == 0)
							lType = lex_const;
						else if(memcmp(code, "false", 5) == 0)
							lType = lex_false;
						break;
					case 6:
						if(memcmp(code, "switch", 6) == 0)
							lType = lex_switch;
						else if(memcmp(code, "return", 6) == 0)
							lType = lex_return;
						else if(memcmp(code, "typeof", 6) == 0)
							lType = lex_typeof;
						else if(memcmp(code, "sizeof", 6) == 0)
							lType = lex_sizeof;
						else if(memcmp(code, "import", 6) == 0)
							lType = lex_import;
						break;
					case 7:
						if(memcmp(code, "noalign", 7) == 0)
							lType = lex_noalign;
						else if(memcmp(code, "default", 7) == 0)
							lType = lex_default;
						else if(memcmp(code, "typedef", 7) == 0)
							lType = lex_typedef;
						else if(memcmp(code, "nullptr", 7) == 0)
							lType = lex_nullptr;
						else if(memcmp(code, "generic", 7) == 0)
							lType = lex_generic;
						break;
					case 8:
						if(memcmp(code, "continue", 8) == 0)
							lType = lex_continue;
						else if(memcmp(code, "operator", 8) == 0)
							lType = lex_operator;
						break;
					case 9:
						if(memcmp(code, "coroutine", 9) == 0)
							lType = lex_coroutine;
						else if(memcmp(code, "namespace", 9) == 0)
							lType = lex_namespace;
						break;
					case 10:
						if(memcmp(code, "extendable", 10) == 0)
							lType = lex_extendable;
						break;
					}
				}

				if(lType == lex_none)
					lType = lex_string;
			}
		}
		Lexeme lex;

		lex.type = lType;
		lex.length = lLength;

		lex.pos = code;

		lex.line = line;
		lex.column = unsigned(code - lineStart);

		lexems.push_back(lex);

		code += lLength;
		lType = lex_none;
		lLength = 1;
	}

	Lexeme lex;

	lex.type = lex_none;
	lex.length = 1;

	lex.pos = code;

	lex.line = line;
	lex.column = unsigned(code - lineStart);

	lexems.push_back(lex);
}